

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

void Fra_ImpRecordInManager(Fra_Man_t *p,Aig_Man_t *pNew)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  int i_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_3c;
  int i;
  int Imp;
  int nPosOld;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pRight;
  Aig_Obj_t *pLeft;
  Aig_Man_t *pNew_local;
  Fra_Man_t *p_local;
  
  if ((p->pCla->vImps != (Vec_Int_t *)0x0) && (iVar2 = Vec_IntSize(p->pCla->vImps), iVar2 != 0)) {
    iVar2 = Aig_ManCoNum(pNew);
    for (local_3c = 0; iVar3 = Vec_IntSize(p->pCla->vImps), local_3c < iVar3;
        local_3c = local_3c + 1) {
      iVar3 = Vec_IntEntry(p->pCla->vImps,local_3c);
      pAVar1 = p->pManAig;
      i_00 = Fra_ImpLeft(iVar3);
      pAVar4 = Aig_ManObj(pAVar1,i_00);
      pAVar1 = p->pManAig;
      iVar3 = Fra_ImpRight(iVar3);
      pAVar5 = Aig_ManObj(pAVar1,iVar3);
      pAVar4 = Aig_NotCond((Aig_Obj_t *)(pAVar4->field_5).pData,
                           (uint)(((*(ulong *)&pAVar4->field_0x18 >> 3 & 1) != 0 ^ 0xffU) & 1));
      pAVar5 = Aig_NotCond((Aig_Obj_t *)(pAVar5->field_5).pData,
                           (uint)(*(ulong *)&pAVar5->field_0x18 >> 3) & 1);
      pAVar4 = Aig_Or(pNew,pAVar4,pAVar5);
      Aig_ObjCreateCo(pNew,pAVar4);
    }
    iVar3 = Aig_ManCoNum(pNew);
    pNew->nAsserts = iVar3 - iVar2;
  }
  return;
}

Assistant:

void Fra_ImpRecordInManager( Fra_Man_t * p, Aig_Man_t * pNew )
{
    Aig_Obj_t * pLeft, * pRight, * pMiter;
    int nPosOld, Imp, i;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return;
    // go through the implication
    nPosOld = Aig_ManCoNum(pNew);
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // record the implication: L' + R
        pMiter = Aig_Or( pNew, 
            Aig_NotCond((Aig_Obj_t *)pLeft->pData, !pLeft->fPhase), 
            Aig_NotCond((Aig_Obj_t *)pRight->pData, pRight->fPhase) ); 
        Aig_ObjCreateCo( pNew, pMiter );
    }
    pNew->nAsserts = Aig_ManCoNum(pNew) - nPosOld;
}